

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

int pmain(lua_State *L)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  lua_Integer lVar5;
  char **argv;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint script;
  uint uVar10;
  ulong n;
  uint uVar11;
  uint uVar12;
  
  uVar12 = 0;
  lVar5 = lua_tointegerx(L,1,(int *)0x0);
  argv = (char **)lua_touserdata(L,2);
  pcVar7 = *argv;
  if (pcVar7 == (char *)0x0) {
    script = 0xffffffff;
  }
  else {
    if (*pcVar7 != '\0') {
      progname = pcVar7;
    }
    pcVar7 = argv[1];
    if (pcVar7 == (char *)0x0) {
      script = 0;
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      script = 1;
      do {
        if (*pcVar7 != '-') goto LAB_00106112;
        bVar1 = pcVar7[1];
        if (bVar1 < 0x69) {
          if (bVar1 < 0x57) {
            if (bVar1 == 0x45) {
              if (pcVar7[2] == '\0') {
                uVar12 = uVar12 | 0x10;
                goto LAB_001060c5;
              }
            }
            else {
              if (bVar1 == 0) goto LAB_00106112;
              if (bVar1 == 0x2d) {
                uVar11 = 1;
                if (pcVar7[2] == '\0') {
                  uVar11 = uVar12;
                }
                uVar12 = uVar11;
                script = script + (pcVar7[2] == '\0');
                goto LAB_00106112;
              }
            }
          }
          else if (bVar1 == 0x57) {
            if (pcVar7[2] == '\0') goto LAB_001060c5;
          }
          else if (bVar1 == 0x65) {
            uVar12 = uVar12 | 8;
            goto LAB_00106082;
          }
LAB_0010610c:
          uVar12 = 1;
          goto LAB_00106112;
        }
        if (bVar1 == 0x69) {
          uVar12 = uVar12 | 2;
LAB_001060bb:
          if (pcVar7[2] != '\0') goto LAB_0010610c;
          uVar12 = uVar12 | 4;
        }
        else {
          if (bVar1 != 0x6c) {
            if (bVar1 != 0x76) goto LAB_0010610c;
            goto LAB_001060bb;
          }
LAB_00106082:
          if (pcVar7[2] == '\0') {
            if ((argv[(long)(int)script + 1] == (char *)0x0) ||
               (*argv[(long)(int)script + 1] == '-')) goto LAB_0010610c;
            script = script + 1;
          }
        }
LAB_001060c5:
        lVar6 = (long)(int)script;
        script = script + 1;
        pcVar7 = argv[lVar6 + 1];
      } while (pcVar7 != (char *)0x0);
      script = 0;
    }
  }
LAB_00106112:
  uVar10 = (uint)lVar5;
  uVar11 = uVar10;
  if (0 < (int)script) {
    uVar11 = script;
  }
  luaL_checkversion_(L,504.0,0x88);
  if (uVar12 == 1) {
    pmain_cold_1();
    return 0;
  }
  if ((uVar12 & 4) != 0) {
    print_version();
  }
  if ((uVar12 & 0x10) == 0) {
    luaL_openlibs(L);
    createargtable(L,argv,uVar10,script);
    lua_gc(L,1);
    lua_gc(L,10,0);
    pcVar7 = getenv("LUA_INIT_5_4");
    if (pcVar7 == (char *)0x0) {
      pcVar7 = getenv("LUA_INIT");
      if (pcVar7 == (char *)0x0) goto LAB_00106249;
      pcVar9 = "=LUA_INIT";
    }
    else {
      pcVar9 = "=LUA_INIT_5_4";
    }
    if (*pcVar7 == '@') {
      iVar3 = luaL_loadfilex(L,pcVar7 + 1,(char *)0x0);
      iVar3 = dochunk(L,iVar3);
    }
    else {
      iVar3 = dostring(L,pcVar7,pcVar9);
    }
    if (iVar3 != 0) {
      return 0;
    }
  }
  else {
    lua_pushboolean(L,1);
    lua_setfield(L,-0xf4628,"LUA_NOENV");
    luaL_openlibs(L);
    createargtable(L,argv,uVar10,script);
    lua_gc(L,1);
    lua_gc(L,10,0);
  }
LAB_00106249:
  if (1 < (int)uVar11) {
    iVar3 = 1;
    do {
      pcVar7 = argv[iVar3];
      cVar2 = pcVar7[1];
      if (cVar2 == 'W') {
        lua_warning(L,"@on",0);
      }
      else if ((cVar2 == 'l') || (cVar2 == 'e')) {
        if (pcVar7[2] == '\0') {
          pcVar7 = argv[(long)iVar3 + 1];
          iVar3 = iVar3 + 1;
        }
        else {
          pcVar7 = pcVar7 + 2;
        }
        if (cVar2 == 'e') {
          iVar4 = dostring(L,pcVar7,"=(command line)");
          if (iVar4 != 0) {
            return 0;
          }
        }
        else {
          pcVar9 = strchr(pcVar7,0x3d);
          if (pcVar9 == (char *)0x0) {
            pcVar8 = strchr(pcVar7,0x2d);
            pcVar9 = pcVar7;
          }
          else {
            *pcVar9 = '\0';
            pcVar8 = (char *)0x0;
            pcVar9 = pcVar9 + 1;
          }
          lua_getglobal(L,"require");
          lua_pushstring(L,pcVar9);
          iVar4 = docall(L,1,1);
          if (iVar4 != 0) {
            report(L,iVar4);
            return 0;
          }
          if (pcVar8 != (char *)0x0) {
            *pcVar8 = '\0';
          }
          lua_setglobal(L,pcVar7);
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (int)uVar11);
  }
  if (0 < (int)script) {
    pcVar7 = argv[script];
    if ((*pcVar7 == '-') && (pcVar7[1] == '\0')) {
      pcVar9 = argv[(ulong)script - 1];
      if ((*pcVar9 == '-') && (pcVar9[1] == '-')) {
        if (pcVar9[2] != '\0') {
          pcVar7 = (char *)0x0;
        }
      }
      else {
        pcVar7 = (char *)0x0;
      }
    }
    iVar3 = luaL_loadfilex(L,pcVar7,(char *)0x0);
    if (iVar3 != 0) {
      report(L,iVar3);
      return 0;
    }
    iVar3 = lua_getglobal(L,"arg");
    if (iVar3 != 5) {
      luaL_error(L,"\'arg\' is not a table");
    }
    uVar10 = 0xffffffff;
    lVar5 = luaL_len(L,-1);
    uVar11 = (uint)lVar5;
    luaL_checkstack(L,uVar11 + 3,"too many arguments to script");
    if (0 < (int)uVar11) {
      n = 1;
      iVar3 = -1;
      do {
        lua_rawgeti(L,iVar3,n);
        n = n + 1;
        iVar3 = iVar3 + -1;
      } while (uVar11 + 1 != n);
      uVar10 = ~uVar11;
    }
    lua_rotate(L,uVar10,-1);
    lua_settop(L,-2);
    iVar3 = docall(L,uVar11,-1);
    report(L,iVar3);
    if (iVar3 != 0) {
      return 0;
    }
  }
  if ((uVar12 & 2) == 0) {
    if ((0 < (int)script) || ((uVar12 & 0xc) != 0)) goto LAB_001064cb;
    print_version();
  }
  doREPL(L);
LAB_001064cb:
  lua_pushboolean(L,1);
  return 1;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  int optlim = (script > 0) ? script : argc; /* first argv not an option */
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (args == has_error) {  /* bad arg? */
    print_usage(argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version();
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  lua_gc(L, LUA_GCRESTART);  /* start GC... */
  lua_gc(L, LUA_GCGEN, 0, 0);  /* ...in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, optlim))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script > 0) {  /* execute main script (if there is one) */
    if (handle_script(L, argv + script) != LUA_OK)
      return 0;  /* interrupt in case of error */
  }
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script < 1 && !(args & (has_e | has_v))) { /* no active option? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version();
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}